

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::Sub(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = IsNegative(this);
  bVar2 = IsNegative(operand);
  if (bVar1 == bVar2) {
    sub(this,operand);
  }
  else {
    add(this,operand);
  }
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Sub( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		sub( operand );
	} else {
		// result sign will be the same of first operand
		add( operand );
	}
	removeLeadingZeros();
}